

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_Diablo3.cpp
# Opt level: O0

int __thiscall TDiabloRoot::ParseDirectory_Phase2(TDiabloRoot *this)

{
  ulong local_430;
  size_t i;
  char szPathBuffer [1024];
  PATH_BUFFER PathBuffer;
  TDiabloRoot *this_local;
  
  for (local_430 = 0; local_430 < 0x20; local_430 = local_430 + 1) {
    if (this->RootFolders[local_430].pbDirectoryData != (LPBYTE)0x0) {
      szPathBuffer._1016_8_ = &i;
      i._0_1_ = 0;
      if (this->RootFolders[local_430].dwNodeIndex != 0) {
        CASC_FILE_TREE::PathAt
                  (&(this->super_TFileTreeRoot).FileTree,(char *)&i,0x400,
                   (ulong)this->RootFolders[local_430].dwNodeIndex);
        strlen((char *)&i);
      }
      ParseAssetEntries(this,this->RootFolders + local_430,(PATH_BUFFER *)(szPathBuffer + 0x3f8));
      ParseAssetAndIdxEntries
                (this,this->RootFolders + local_430,(PATH_BUFFER *)(szPathBuffer + 0x3f8));
    }
  }
  return 0;
}

Assistant:

int ParseDirectory_Phase2()
    {
        PATH_BUFFER PathBuffer;
        char szPathBuffer[MAX_PATH];

        // Parse each root subdirectory
        for(size_t i = 0; i < DIABLO3_MAX_ROOT_FOLDERS; i++)
        {
            // Is this root folder loaded?
            if(RootFolders[i].pbDirectoryData != NULL)
            {
                PathBuffer.szBegin = szPathBuffer;
                PathBuffer.szPtr = szPathBuffer;
                PathBuffer.szEnd = szPathBuffer + MAX_PATH - 1;
                szPathBuffer[0] = 0;

                // Retrieve the parent name
                if(RootFolders[i].dwNodeIndex != 0)
                {
                    FileTree.PathAt(szPathBuffer, MAX_PATH, RootFolders[i].dwNodeIndex);
                    PathBuffer.szPtr = PathBuffer.szBegin + strlen(szPathBuffer);
                }

//              FILE * fp = fopen("E:\\FileIndex.txt", "wt");

                // Array of DIABLO3_ASSET_ENTRY entries.
                // These are for files belonging to an asset, without subitem number.
                // Example: "SoundBank\SoundFile.smp"
                ParseAssetEntries(RootFolders[i], PathBuffer);

                // Array of DIABLO3_ASSETIDX_ENTRY entries.
                // These are for files belonging to an asset, with a subitem number.
                // Example: "SoundBank\SoundFile\0001.smp"
                ParseAssetAndIdxEntries(RootFolders[i], PathBuffer);

//              fclose(fp);
            }
        }

        return ERROR_SUCCESS;
    }